

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_sqrt_mips64el(floatx80 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  ushort uVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  uint32_t bLow;
  ulong uVar8;
  uint32_t aLow;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  floatx80 fVar25;
  floatx80 fVar26;
  
  uVar11 = a._8_8_;
  uVar14 = a.low;
  uVar4 = a.high;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)uVar14
     ) {
LAB_0092e589:
    status->float_exception_flags = status->float_exception_flags | 1;
    if (status->snan_bit_is_one != '\0') {
      __assert_fail("!snan_bit_is_one(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat-specialize.inc.c"
                    ,0xc5,"floatx80 floatx80_default_nan_mips64el(float_status *)");
    }
    uVar14 = 0xc000000000000000;
    uVar11 = CONCAT62(a._10_6_,0xffff);
    goto LAB_0092e983;
  }
  uVar17 = (uint)(uVar4 & 0x7fff);
  if ((uVar4 & 0x7fff) == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      if (-1 < (short)uVar4) goto LAB_0092e983;
      goto LAB_0092e589;
    }
    auVar3 = a._0_12_;
    fVar25._12_4_ = 0;
    fVar25.low = auVar3._0_8_;
    fVar25.high = auVar3._8_2_;
    fVar25._10_2_ = auVar3._10_2_;
    fVar25 = propagateFloatx80NaN_mips64el(a,fVar25,status);
    auVar3 = fVar25._0_12_;
  }
  else {
    if ((short)uVar4 < 0) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 && uVar14 == 0)
      goto LAB_0092e983;
      goto LAB_0092e589;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
      if (uVar14 == 0) {
        uVar14 = 0;
        uVar11 = 0;
        goto LAB_0092e983;
      }
      uVar11 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      uVar14 = uVar14 << ((byte)(uVar11 ^ 0x3f) & 0x3f);
      uVar17 = 1 - (int)(uVar11 ^ 0x3f);
    }
    uVar11 = uVar14 >> 0x20;
    uVar10 = (uint)(uVar14 >> 0x20);
    if ((uVar17 & 1) == 0) {
      uVar16 = (uVar10 >> 0x11 | 0x8000) -
               (uint)*(ushort *)
                      (estimateSqrt32_sqrtEvenAdjustments + (ulong)(uVar10 >> 0x1b & 0xf) * 2);
      uVar16 = (int)(uVar11 / uVar16) + uVar16;
      uVar9 = 0xffff8000;
      if (uVar16 < 0x20000) {
        uVar9 = uVar16 * 0x8000;
      }
      if (uVar10 < uVar9) goto LAB_0092e6ac;
      uVar10 = (int)uVar10 >> 1;
    }
    else {
      uVar9 = ((uVar10 >> 0x11) -
              (uint)*(ushort *)
                     (estimateSqrt32_sqrtOddAdjustments + (ulong)(uVar10 >> 0x1b & 0xf) * 2)) +
              0x4000;
      uVar9 = uVar9 * 0x8000 + (int)(uVar11 / uVar9) * 0x4000;
      uVar11 = (ulong)(uVar10 >> 1);
LAB_0092e6ac:
      uVar10 = (uVar9 >> 1) + (int)((uVar11 << 0x1f) / (ulong)uVar9);
    }
    uVar13 = CONCAT44(0,uVar10);
    bVar7 = (byte)(uVar17 & 1) | 2;
    uVar12 = uVar14 >> bVar7;
    uVar14 = uVar14 << (-bVar7 & 0x3f);
    uVar11 = 0xffffffffffffffff;
    if (uVar12 < uVar13 << 0x20) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar13;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar12;
      uVar20 = SUB168(auVar2 / auVar1,0) << 0x20;
      for (lVar5 = uVar12 - SUB164(auVar2 / auVar1,0) * uVar13; lVar5 < 0; lVar5 = lVar5 + uVar13) {
        uVar20 = uVar20 - 0x100000000;
      }
      uVar11 = lVar5 << 0x20 | uVar14 >> 0x20;
      if (uVar11 < uVar13 << 0x20) {
        uVar11 = uVar11 / uVar13;
      }
      else {
        uVar11 = 0xffffffff;
      }
      uVar11 = uVar11 | uVar20;
    }
    uVar8 = uVar11 + uVar13 * 0x40000000;
    uVar20 = uVar8 * 2;
    uVar21 = uVar8 >> 0x20;
    uVar22 = (uVar8 & 0xffffffff) * uVar21;
    uVar18 = uVar22 >> 0x1f;
    uVar8 = uVar8 * uVar8;
    uVar15 = uVar14 - uVar8;
    lVar5 = ((uVar12 - (uVar14 < uVar8)) -
            ((uVar18 & 0xffffffff) + uVar21 * uVar21 + (uVar18 & 0x100000000))) -
            (ulong)(uVar8 < uVar22 << 0x21);
    if (lVar5 < 0) {
      lVar6 = uVar11 + uVar13 * 0x40000000;
      uVar14 = uVar20;
      do {
        lVar6 = lVar6 + -1;
        uVar20 = uVar14 - 2;
        bVar23 = CARRY8(uVar15,uVar14 - 1);
        uVar15 = uVar15 + (uVar14 - 1);
        lVar5 = (lVar5 - (lVar6 >> 0x3f)) + (ulong)bVar23;
        uVar14 = uVar20;
      } while (lVar5 < 0);
    }
    uVar14 = 0xffffffffffffffff;
    if (uVar15 < uVar20) {
      uVar11 = uVar20 >> 0x20;
      uVar13 = 0xffffffff00000000;
      if (uVar15 < (uVar20 & 0xffffffff00000000)) {
        uVar13 = uVar15 / uVar11 << 0x20;
      }
      uVar8 = (uVar20 & 0xffffffff) * (uVar13 >> 0x20);
      uVar12 = uVar13 * uVar20;
      uVar14 = -uVar12;
      lVar5 = ((uVar15 - ((uVar8 >> 0x20) + (uVar13 >> 0x20) * uVar11)) - (ulong)(uVar12 != 0)) -
              (ulong)(uVar12 < uVar8 << 0x20);
      if (lVar5 < 0) {
        uVar12 = (0x100000000 - uVar13) * uVar20;
        uVar8 = uVar14;
        do {
          uVar13 = uVar13 - 0x100000000;
          uVar14 = uVar8 + (uVar20 << 0x20);
          bVar23 = uVar12 < uVar8;
          uVar12 = uVar12 + (uVar20 << 0x20);
          lVar5 = lVar5 + uVar11 + (ulong)bVar23;
          uVar8 = uVar14;
        } while (lVar5 < 0);
      }
      uVar14 = uVar14 >> 0x20 | lVar5 << 0x20;
      if (uVar14 < (uVar20 & 0xffffffff00000000)) {
        uVar14 = uVar14 / uVar11;
      }
      else {
        uVar14 = 0xffffffff;
      }
      uVar14 = uVar14 | uVar13;
    }
    if ((uVar14 & 0x3ffffffffffffffe) < 6) {
      uVar14 = uVar14 + (uVar14 == 0);
      uVar13 = uVar14 >> 0x20;
      uVar11 = (uVar20 & 0xffffffff) * uVar13;
      uVar12 = (uVar14 & 0xffffffff) * (uVar20 >> 0x20);
      lVar5 = 0;
      uVar8 = uVar12 + uVar11;
      if (CARRY8(uVar12,uVar11)) {
        lVar5 = -0x100000000;
      }
      uVar11 = uVar14 * uVar20;
      uVar18 = (uVar14 & 0xffffffff) * uVar13;
      uVar12 = uVar18 >> 0x1f;
      uVar21 = uVar14 * uVar14;
      uVar19 = (uVar12 & 0xffffffff) + uVar13 * uVar13 + (uVar12 & 0x100000000) +
               (ulong)(uVar21 < uVar18 << 0x21);
      uVar12 = -uVar11 - uVar19;
      uVar22 = -uVar21;
      uVar18 = uVar12 - (uVar21 != 0);
      lVar5 = (((((uVar15 - (uVar11 != 0)) - ((uVar8 >> 0x20) + (uVar20 >> 0x20) * uVar13)) + lVar5)
               - (ulong)(uVar11 < uVar8 << 0x20)) - (ulong)(-uVar11 < uVar19)) -
              (ulong)(uVar12 < (uVar21 != 0));
      if (lVar5 < 0) {
        uVar11 = uVar14 * 2 - 1;
        do {
          uVar14 = uVar14 - 1;
          uVar13 = uVar14 >> 0x3f | uVar20;
          bVar23 = CARRY8(uVar22,uVar11);
          uVar22 = uVar22 + uVar11;
          bVar24 = CARRY8(uVar18,uVar13);
          uVar13 = uVar18 + uVar13;
          uVar18 = uVar13 + bVar23;
          lVar5 = lVar5 + (ulong)(bVar24 || CARRY8(uVar13,(ulong)bVar23));
          uVar11 = uVar11 - 2;
        } while (lVar5 < 0);
      }
      uVar14 = uVar14 | ((lVar5 != 0 || uVar18 != 0) || uVar22 != 0);
    }
    fVar25 = roundAndPackFloatx80_mips64el
                       (status->floatx80_rounding_precision,'\0',
                        ((int)(uVar17 - 0x3fff) >> 1) + 0x3fff,uVar14 >> 0x3f | uVar20,uVar14 * 2,
                        status);
    auVar3 = fVar25._0_12_;
  }
  uVar14 = auVar3._0_8_;
  uVar11 = (ulong)auVar3._8_4_;
LAB_0092e983:
  fVar26._8_8_ = uVar11 & 0xffffffff;
  fVar26.low = uVar14;
  return fVar26;
}

Assistant:

floatx80 floatx80_sqrt(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig0 = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig0 << 1)) {
            return propagateFloatx80NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( aSig0 == 0 ) return packFloatx80( 0, 0, 0 );
        normalizeFloatx80Subnormal( aSig0, &aExp, &aSig0 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFF;
    zSig0 = estimateSqrt32( aExp, aSig0>>32 );
    shift128Right( aSig0, 0, 2 + ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & UINT64_C(0x3FFFFFFFFFFFFFFF) ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shortShift128Left( 0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= doubleZSig0;
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                0, zExp, zSig0, zSig1, status);
}